

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ImGuiStyle(ImGuiStyle *this)

{
  ImVec4 *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiStyle *local_10;
  ImGuiStyle *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->WindowMinSize);
  ImVec2::ImVec2(&this->WindowTitleAlign);
  ImVec2::ImVec2(&this->FramePadding);
  ImVec2::ImVec2(&this->ItemSpacing);
  ImVec2::ImVec2(&this->ItemInnerSpacing);
  ImVec2::ImVec2(&this->CellPadding);
  ImVec2::ImVec2(&this->TouchExtraPadding);
  ImVec2::ImVec2(&this->ButtonTextAlign);
  ImVec2::ImVec2(&this->SelectableTextAlign);
  ImVec2::ImVec2(&this->DisplayWindowPadding);
  ImVec2::ImVec2(&this->DisplaySafeAreaPadding);
  local_78 = this->Colors;
  do {
    ImVec4::ImVec4(local_78);
    local_78 = local_78 + 1;
  } while ((ImGuiStyle *)local_78 != this + 1);
  this->Alpha = 1.0;
  ImVec2::ImVec2(&local_18,8.0,8.0);
  this->WindowPadding = local_18;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 1.0;
  ImVec2::ImVec2(&local_20,32.0,32.0);
  this->WindowMinSize = local_20;
  ImVec2::ImVec2(&local_28,0.0,0.5);
  this->WindowTitleAlign = local_28;
  this->WindowMenuButtonPosition = 0;
  this->ChildRounding = 0.0;
  this->ChildBorderSize = 1.0;
  this->PopupRounding = 0.0;
  this->PopupBorderSize = 1.0;
  ImVec2::ImVec2(&local_30,4.0,3.0);
  this->FramePadding = local_30;
  this->FrameRounding = 0.0;
  this->FrameBorderSize = 0.0;
  ImVec2::ImVec2(&local_38,8.0,4.0);
  this->ItemSpacing = local_38;
  ImVec2::ImVec2(&local_40,4.0,4.0);
  this->ItemInnerSpacing = local_40;
  ImVec2::ImVec2(&local_48,4.0,2.0);
  this->CellPadding = local_48;
  ImVec2::ImVec2(&local_50,0.0,0.0);
  this->TouchExtraPadding = local_50;
  this->IndentSpacing = 21.0;
  this->ColumnsMinSpacing = 6.0;
  this->ScrollbarSize = 14.0;
  this->ScrollbarRounding = 9.0;
  this->GrabMinSize = 10.0;
  this->GrabRounding = 0.0;
  this->LogSliderDeadzone = 4.0;
  this->TabRounding = 4.0;
  this->TabBorderSize = 0.0;
  this->TabMinWidthForCloseButton = 0.0;
  this->ColorButtonPosition = 1;
  ImVec2::ImVec2(&local_58,0.5,0.5);
  this->ButtonTextAlign = local_58;
  ImVec2::ImVec2(&local_60,0.0,0.0);
  this->SelectableTextAlign = local_60;
  ImVec2::ImVec2(&local_68,19.0,19.0);
  this->DisplayWindowPadding = local_68;
  ImVec2::ImVec2(&local_70,3.0,3.0);
  this->DisplaySafeAreaPadding = local_70;
  this->MouseCursorScale = 1.0;
  this->AntiAliasedLines = true;
  this->AntiAliasedLinesUseTex = true;
  this->AntiAliasedFill = true;
  this->CurveTessellationTol = 1.25;
  this->CircleTessellationMaxError = 0.3;
  ImGui::StyleColorsDark(this);
  return;
}

Assistant:

ImGuiStyle::ImGuiStyle()
{
    Alpha                   = 1.0f;             // Global alpha applies to everything in ImGui
    WindowPadding           = ImVec2(8,8);      // Padding within a window
    WindowRounding          = 0.0f;             // Radius of window corners rounding. Set to 0.0f to have rectangular windows. Large values tend to lead to variety of artifacts and are not recommended.
    WindowBorderSize        = 1.0f;             // Thickness of border around windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    WindowMinSize           = ImVec2(32,32);    // Minimum window size
    WindowTitleAlign        = ImVec2(0.0f,0.5f);// Alignment for title bar text
    WindowMenuButtonPosition= ImGuiDir_Left;    // Position of the collapsing/docking button in the title bar (left/right). Defaults to ImGuiDir_Left.
    ChildRounding           = 0.0f;             // Radius of child window corners rounding. Set to 0.0f to have rectangular child windows
    ChildBorderSize         = 1.0f;             // Thickness of border around child windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    PopupRounding           = 0.0f;             // Radius of popup window corners rounding. Set to 0.0f to have rectangular child windows
    PopupBorderSize         = 1.0f;             // Thickness of border around popup or tooltip windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    FramePadding            = ImVec2(4,3);      // Padding within a framed rectangle (used by most widgets)
    FrameRounding           = 0.0f;             // Radius of frame corners rounding. Set to 0.0f to have rectangular frames (used by most widgets).
    FrameBorderSize         = 0.0f;             // Thickness of border around frames. Generally set to 0.0f or 1.0f. Other values not well tested.
    ItemSpacing             = ImVec2(8,4);      // Horizontal and vertical spacing between widgets/lines
    ItemInnerSpacing        = ImVec2(4,4);      // Horizontal and vertical spacing between within elements of a composed widget (e.g. a slider and its label)
    CellPadding             = ImVec2(4,2);      // Padding within a table cell
    TouchExtraPadding       = ImVec2(0,0);      // Expand reactive bounding box for touch-based system where touch position is not accurate enough. Unfortunately we don't sort widgets so priority on overlap will always be given to the first widget. So don't grow this too much!
    IndentSpacing           = 21.0f;            // Horizontal spacing when e.g. entering a tree node. Generally == (FontSize + FramePadding.x*2).
    ColumnsMinSpacing       = 6.0f;             // Minimum horizontal spacing between two columns. Preferably > (FramePadding.x + 1).
    ScrollbarSize           = 14.0f;            // Width of the vertical scrollbar, Height of the horizontal scrollbar
    ScrollbarRounding       = 9.0f;             // Radius of grab corners rounding for scrollbar
    GrabMinSize             = 10.0f;            // Minimum width/height of a grab box for slider/scrollbar
    GrabRounding            = 0.0f;             // Radius of grabs corners rounding. Set to 0.0f to have rectangular slider grabs.
    LogSliderDeadzone       = 4.0f;             // The size in pixels of the dead-zone around zero on logarithmic sliders that cross zero.
    TabRounding             = 4.0f;             // Radius of upper corners of a tab. Set to 0.0f to have rectangular tabs.
    TabBorderSize           = 0.0f;             // Thickness of border around tabs.
    TabMinWidthForCloseButton = 0.0f;           // Minimum width for close button to appears on an unselected tab when hovered. Set to 0.0f to always show when hovering, set to FLT_MAX to never show close button unless selected.
    ColorButtonPosition     = ImGuiDir_Right;   // Side of the color button in the ColorEdit4 widget (left/right). Defaults to ImGuiDir_Right.
    ButtonTextAlign         = ImVec2(0.5f,0.5f);// Alignment of button text when button is larger than text.
    SelectableTextAlign     = ImVec2(0.0f,0.0f);// Alignment of selectable text. Defaults to (0.0f, 0.0f) (top-left aligned). It's generally important to keep this left-aligned if you want to lay multiple items on a same line.
    DisplayWindowPadding    = ImVec2(19,19);    // Window position are clamped to be visible within the display area or monitors by at least this amount. Only applies to regular windows.
    DisplaySafeAreaPadding  = ImVec2(3,3);      // If you cannot see the edge of your screen (e.g. on a TV) increase the safe area padding. Covers popups/tooltips as well regular windows.
    MouseCursorScale        = 1.0f;             // Scale software rendered mouse cursor (when io.MouseDrawCursor is enabled). May be removed later.
    AntiAliasedLines        = true;             // Enable anti-aliased lines/borders. Disable if you are really tight on CPU/GPU.
    AntiAliasedLinesUseTex  = true;             // Enable anti-aliased lines/borders using textures where possible. Require backend to render with bilinear filtering.
    AntiAliasedFill         = true;             // Enable anti-aliased filled shapes (rounded rectangles, circles, etc.).
    CurveTessellationTol    = 1.25f;            // Tessellation tolerance when using PathBezierCurveTo() without a specific number of segments. Decrease for highly tessellated curves (higher quality, more polygons), increase to reduce quality.
    CircleTessellationMaxError = 0.30f;         // Maximum error (in pixels) allowed when using AddCircle()/AddCircleFilled() or drawing rounded corner rectangles with no explicit segment count specified. Decrease for higher quality but more geometry.

    // Default theme
    ImGui::StyleColorsDark(this);
}